

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O2

ExpressionValue *
expFuncAbs(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
          vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  pointer pEVar1;
  long lVar2;
  long lVar3;
  ExpressionValue *result;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  pEVar1 = (parameters->super__Vector_base<ExpressionValue,_std::allocator<ExpressionValue>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (pEVar1->type == Integer) {
    __return_storage_ptr__->type = Integer;
    lVar2 = (pEVar1->field_1).intValue;
    lVar3 = -lVar2;
    if (0 < lVar2) {
      lVar3 = lVar2;
    }
    (__return_storage_ptr__->field_1).intValue = lVar3;
  }
  else if (pEVar1->type == Float) {
    __return_storage_ptr__->type = Float;
    (__return_storage_ptr__->field_1).intValue = (pEVar1->field_1).intValue & 0x7fffffffffffffff;
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncAbs(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	ExpressionValue result;

	switch (parameters[0].type)
	{
	case ExpressionValueType::Float:
		result.type = ExpressionValueType::Float;
		result.floatValue = fabs(parameters[0].floatValue);
		break;
	case ExpressionValueType::Integer:
		result.type = ExpressionValueType::Integer;
		result.intValue = parameters[0].intValue >= 0 ?
			parameters[0].intValue : -parameters[0].intValue;
		break;
	default:
		break;
	}

	return result;
}